

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O1

void __thiscall
yactfr::internal::JsonAnyFragValReqImpl::
_addToFragValReqs<yactfr::internal::JsonTraceTypeFragValReq>
          (JsonAnyFragValReqImpl *this,JsonTraceTypeFragValReq *valReq)

{
  iterator iVar1;
  allocator local_41;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,"trace-class",&local_41);
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::internal::JsonValReq_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::internal::JsonValReq_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_fragValReqs)._M_h,&local_40);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::internal::JsonValReq_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    local_40._M_dataplus._M_p = "trace-class";
    local_40._M_string_length = (size_type)valReq;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonValReq_const*>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonValReq_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<char_const*,yactfr::internal::JsonTraceTypeFragValReq_const*>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonValReq_const*>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonValReq_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->_fragValReqs);
    return;
  }
  __assert_fail("_fragValReqs.find(typeStr) == _fragValReqs.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/json/ctf-2-json-val-req.cpp"
                ,0x93c,
                "void yactfr::internal::JsonAnyFragValReqImpl::_addToFragValReqs(const JsonValReqT &) [JsonValReqT = yactfr::internal::JsonTraceTypeFragValReq]"
               );
}

Assistant:

void _addToFragValReqs(const JsonValReqT& valReq)
    {
        const auto typeStr = JsonValReqT::typeStr();

        assert(_fragValReqs.find(typeStr) == _fragValReqs.end());
        _fragValReqs.insert(std::make_pair(typeStr, &valReq));
    }